

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::RelativeToRootPath
                   (string *__return_storage_ptr__,string *project,string *filepath)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  string local_108 [32];
  ulong local_e8;
  size_t i;
  ulong local_d8;
  size_t num_up;
  char *suffix;
  size_t common_prefix_len;
  char *b;
  char *a;
  undefined1 local_90 [8];
  string absolute_filepath;
  string local_60;
  undefined1 local_40 [8];
  string absolute_project;
  string *filepath_local;
  string *project_local;
  string *result;
  
  absolute_project.field_2._8_8_ = filepath;
  AbsolutePath(&local_60,project);
  PosixPath((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 != '/') {
    std::__cxx11::string::operator+=((string *)local_40,"/");
  }
  AbsolutePath((string *)&a,(string *)absolute_project.field_2._8_8_);
  PosixPath((string *)local_90,(string *)&a);
  std::__cxx11::string::~string((string *)&a);
  b = (char *)std::__cxx11::string::c_str();
  common_prefix_len = std::__cxx11::string::c_str();
  suffix = (char *)0x0;
  while( true ) {
    pcVar2 = b;
    bVar5 = false;
    if ((*b != '\0') && (bVar5 = false, *(char *)common_prefix_len != '\0')) {
      bVar5 = *b == *(char *)common_prefix_len;
    }
    if (!bVar5) break;
    if (*b == '/') {
      lVar3 = std::__cxx11::string::c_str();
      suffix = pcVar2 + -lVar3;
    }
    b = b + 1;
    common_prefix_len = common_prefix_len + 1;
  }
  lVar3 = std::__cxx11::string::c_str();
  local_d8 = 0;
  num_up = (size_t)(suffix + lVar3);
  while (*(char *)num_up != '\0') {
    sVar4 = num_up + 1;
    cVar1 = *(char *)num_up;
    num_up = sVar4;
    if (cVar1 == '/') {
      local_d8 = local_d8 + 1;
    }
  }
  local_d8 = local_d8 - 1;
  i._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"//",(allocator<char> *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  for (local_e8 = 0; local_e8 < local_d8; local_e8 = local_e8 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"../");
  }
  std::__cxx11::string::substr((ulong)local_108,(ulong)local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_108);
  std::__cxx11::string::~string(local_108);
  i._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeToRootPath(const std::string &project,
                               const std::string &filepath) {
  std::string absolute_project = PosixPath(AbsolutePath(project));
  if (absolute_project.back() != '/') absolute_project += "/";
  std::string absolute_filepath = PosixPath(AbsolutePath(filepath));

  // Find the first character where they disagree.
  // The previous directory is the lowest common ancestor;
  const char *a = absolute_project.c_str();
  const char *b = absolute_filepath.c_str();
  size_t common_prefix_len = 0;
  while (*a != '\0' && *b != '\0' && *a == *b) {
    if (*a == '/') common_prefix_len = a - absolute_project.c_str();
    a++;
    b++;
  }
  // the number of ../ to prepend to b depends on the number of remaining
  // directories in A.
  const char *suffix = absolute_project.c_str() + common_prefix_len;
  size_t num_up = 0;
  while (*suffix != '\0')
    if (*suffix++ == '/') num_up++;
  num_up--;  // last one is known to be '/'.
  std::string result = "//";
  for (size_t i = 0; i < num_up; i++) result += "../";
  result += absolute_filepath.substr(common_prefix_len + 1);

  return result;
}